

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variance.c
# Opt level: O0

uint64_t aom_highbd_sse_odd_size(uint8_t *a,int a_stride,uint8_t *b,int b_stride,int w,int h)

{
  int in_ECX;
  uint8_t *in_RDX;
  int in_ESI;
  uint8_t *in_RDI;
  int in_R8D;
  int in_R9D;
  int64_t sum;
  uint64_t sse;
  int64_t local_38;
  uint64_t local_30 [6];
  
  highbd_variance64(in_RDI,in_ESI,in_RDX,in_ECX,in_R8D,in_R9D,local_30,&local_38);
  return local_30[0];
}

Assistant:

uint64_t aom_highbd_sse_odd_size(const uint8_t *a, int a_stride,
                                 const uint8_t *b, int b_stride, int w, int h) {
  uint64_t sse;
  int64_t sum;
  highbd_variance64(a, a_stride, b, b_stride, w, h, &sse, &sum);
  return sse;
}